

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

FIRSTPASS_STATS * av1_firstpass_info_peek(FIRSTPASS_INFO *firstpass_info,int offset_from_cur)

{
  int index;
  int offset_from_cur_local;
  FIRSTPASS_INFO *firstpass_info_local;
  FIRSTPASS_STATS *local_8;
  
  if ((SBORROW4(offset_from_cur,-firstpass_info->past_stats_count) ==
       offset_from_cur + firstpass_info->past_stats_count < 0) &&
     (offset_from_cur < firstpass_info->future_stats_count)) {
    local_8 = firstpass_info->stats_buf +
              (firstpass_info->cur_index + offset_from_cur) % firstpass_info->stats_buf_size;
  }
  else {
    local_8 = (FIRSTPASS_STATS *)0x0;
  }
  return local_8;
}

Assistant:

const FIRSTPASS_STATS *av1_firstpass_info_peek(
    const FIRSTPASS_INFO *firstpass_info, int offset_from_cur) {
  if (offset_from_cur >= -firstpass_info->past_stats_count &&
      offset_from_cur < firstpass_info->future_stats_count) {
    const int index = (firstpass_info->cur_index + offset_from_cur) %
                      firstpass_info->stats_buf_size;
    return &firstpass_info->stats_buf[index];
  } else {
    return NULL;
  }
}